

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::GeneratePolicyHeaderCode(cmExportFileGenerator *this,ostream *os)

{
  ostream *poVar1;
  ostream *os_local;
  cmExportFileGenerator *this_local;
  
  std::operator<<(os,"# Generated by CMake\n\n");
  poVar1 = std::operator<<(os,"if(\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" LESS 2.8)\n");
  poVar1 = std::operator<<(poVar1,"   message(FATAL_ERROR \"CMake >= 2.8.0 required\")\n");
  poVar1 = std::operator<<(poVar1,"endif()\n");
  poVar1 = std::operator<<(poVar1,"if(CMAKE_VERSION VERSION_LESS \"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->RequiredCMakeVersionMajor);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->RequiredCMakeVersionMinor);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->RequiredCMakeVersionPatch);
  poVar1 = std::operator<<(poVar1,"\")\n");
  poVar1 = std::operator<<(poVar1,"   message(FATAL_ERROR \"CMake >= ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->RequiredCMakeVersionMajor);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->RequiredCMakeVersionMinor);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->RequiredCMakeVersionPatch);
  poVar1 = std::operator<<(poVar1," required\")\n");
  std::operator<<(poVar1,"endif()\n");
  poVar1 = std::operator<<(os,"cmake_policy(PUSH)\n");
  poVar1 = std::operator<<(poVar1,"cmake_policy(VERSION ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->RequiredCMakeVersionMajor);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->RequiredCMakeVersionMinor);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->RequiredCMakeVersionPatch);
  std::operator<<(poVar1,"...3.28)\n");
  return;
}

Assistant:

void cmExportFileGenerator::GeneratePolicyHeaderCode(std::ostream& os)
{
  // Protect that file against use with older CMake versions.
  /* clang-format off */
  os << "# Generated by CMake\n\n";
  os << "if(\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" LESS 2.8)\n"
     << "   message(FATAL_ERROR \"CMake >= 2.8.0 required\")\n"
     << "endif()\n"
     << "if(CMAKE_VERSION VERSION_LESS \""
     << this->RequiredCMakeVersionMajor << '.'
     << this->RequiredCMakeVersionMinor << '.'
     << this->RequiredCMakeVersionPatch << "\")\n"
     << "   message(FATAL_ERROR \"CMake >= "
     << this->RequiredCMakeVersionMajor << '.'
     << this->RequiredCMakeVersionMinor << '.'
     << this->RequiredCMakeVersionPatch << " required\")\n"
     << "endif()\n";
  /* clang-format on */

  // Isolate the file policy level.
  // Support CMake versions as far back as the
  // RequiredCMakeVersion{Major,Minor,Patch}, but also support using NEW
  // policy settings for up to CMake 3.28 (this upper limit may be reviewed
  // and increased from time to time). This reduces the opportunity for CMake
  // warnings when an older export file is later used with newer CMake
  // versions.
  /* clang-format off */
  os << "cmake_policy(PUSH)\n"
     << "cmake_policy(VERSION "
     << this->RequiredCMakeVersionMajor << '.'
     << this->RequiredCMakeVersionMinor << '.'
     << this->RequiredCMakeVersionPatch << "...3.28)\n";
  /* clang-format on */
}